

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLDriver::setBasicRenderStates
          (COpenGLDriver *this,SMaterial *material,SMaterial *lastmaterial,bool resetAllRenderStates
          )

{
  u8 uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  GLenum sourceAlpha;
  undefined7 in_register_00000009;
  GLenum GVar5;
  ulong uVar6;
  GLenum GVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  COpenGLCacheHandler *pCVar10;
  GLenum destinationAlpha;
  long lVar11;
  u32 state;
  bool bVar12;
  f32 fVar13;
  float fVar14;
  f32 fVar15;
  GLfloat color [4];
  undefined8 local_58;
  undefined8 uStack_50;
  E_OPENGL_FIXED_PIPELINE_STATE local_3c;
  SMaterial *local_38;
  
  bVar12 = true;
  if ((int)CONCAT71(in_register_00000009,resetAllRenderStates) == 0) {
    local_3c = this->FixedPipelineState;
    bVar12 = local_3c == EOFPS_DISABLE_TO_ENABLE;
    if (bVar12) goto LAB_001e5a3a;
    if (local_3c == EOFPS_ENABLE_TO_DISABLE) {
      glDisable(0xb57);
      glDisable(0xb50);
      glDisable(0xb60);
      glDisable();
      local_3c = EOFPS_DISABLE;
    }
    else if (local_3c == EOFPS_ENABLE) goto LAB_001e5a3a;
    goto LAB_001e5f43;
  }
LAB_001e5a3a:
  if ((!bVar12) &&
     (((*(ushort *)&material->field_0xa2 ^ *(ushort *)&lastmaterial->field_0xa2) & 0x70) == 0))
  goto LAB_001e5b2f;
  switch(*(ushort *)&material->field_0xa2 >> 4 & 7) {
  case 0:
    glDisable();
    goto switchD_001e5a7c_default;
  case 1:
    uVar8 = 0x1201;
    break;
  case 2:
    uVar8 = 0x1200;
    break;
  case 3:
    uVar8 = 0x1600;
    break;
  case 4:
    uVar8 = 0x1202;
    break;
  case 5:
    uVar8 = 0x1602;
    break;
  default:
    goto switchD_001e5a7c_default;
  }
  glColorMaterial(0x408,uVar8);
switchD_001e5a7c_default:
  if ((material->field_0xa2 & 0x70) != 0) {
    glEnable();
  }
LAB_001e5b2f:
  if ((((bVar12) || ((material->AmbientColor).color != (lastmaterial->AmbientColor).color)) ||
      ((material->DiffuseColor).color != (lastmaterial->DiffuseColor).color)) ||
     (((material->EmissiveColor).color != (lastmaterial->EmissiveColor).color ||
      (((*(ushort *)&material->field_0xa2 ^ *(ushort *)&lastmaterial->field_0xa2) & 0x70) != 0)))) {
    uVar2 = *(ushort *)&material->field_0xa2 >> 4 & 7;
    if ((uVar2 != 2) && (uVar2 != 5)) {
      uVar3 = (material->AmbientColor).color;
      local_58 = CONCAT44((float)(uVar3 >> 8 & 0xff) * 0.003921569,
                          (float)(uVar3 >> 0x10 & 0xff) * 0.003921569);
      uStack_50 = CONCAT44((float)(uVar3 >> 0x18) * 0.003921569,(float)(uVar3 & 0xff) * 0.003921569)
      ;
      glMaterialfv(0x408,0x1200);
    }
    if ((*(ushort *)&material->field_0xa2 >> 4 & 7 | 4) != 5) {
      uVar3 = (material->DiffuseColor).color;
      local_58 = CONCAT44((float)(uVar3 >> 8 & 0xff) * 0.003921569,
                          (float)(uVar3 >> 0x10 & 0xff) * 0.003921569);
      uStack_50 = CONCAT44((float)(uVar3 >> 0x18) * 0.003921569,(float)(uVar3 & 0xff) * 0.003921569)
      ;
      glMaterialfv(0x408,0x1201);
    }
    if ((*(ushort *)&material->field_0xa2 & 0x70) != 0x30) {
      uVar3 = (material->EmissiveColor).color;
      local_58 = CONCAT44((float)(uVar3 >> 8 & 0xff) * 0.003921569,
                          (float)(uVar3 >> 0x10 & 0xff) * 0.003921569);
      uStack_50 = CONCAT44((float)(uVar3 >> 0x18) * 0.003921569,(float)(uVar3 & 0xff) * 0.003921569)
      ;
      glMaterialfv(0x408,0x1600);
    }
  }
  if (((bVar12) || ((material->SpecularColor).color != (lastmaterial->SpecularColor).color)) ||
     (((float)lastmaterial->Shininess != (float)material->Shininess ||
      ((NAN((float)lastmaterial->Shininess) || NAN((float)material->Shininess) ||
       (((*(ushort *)&material->field_0xa2 ^ *(ushort *)&lastmaterial->field_0xa2) & 0x70) != 0)))))
     ) {
    local_58 = 0;
    uStack_50 = 0x3f80000000000000;
    glMaterialf(material->Shininess,0x408,0x1601);
    if ((((float)material->Shininess == 0.0) && (!NAN((float)material->Shininess))) ||
       ((*(ushort *)&material->field_0xa2 & 0x70) == 0x40)) {
      if (this->field_0x5d7 == '\x01') {
        glLightModeli(0x81f8,0x81f9);
      }
    }
    else {
      if (this->field_0x5d7 == '\x01') {
        glLightModeli(0x81f8,0x81fa);
      }
      uVar3 = (material->SpecularColor).color;
      local_58 = CONCAT44((float)(uVar3 >> 8 & 0xff) * 0.003921569,
                          (float)(uVar3 >> 0x10 & 0xff) * 0.003921569);
      uStack_50 = CONCAT44((float)(uVar3 >> 0x18) * 0.003921569,(float)(uVar3 & 0xff) * 0.003921569)
      ;
    }
    glMaterialfv(0x408,0x1202,&local_58);
  }
  if ((bVar12) ||
     (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) & 4) != 0)) {
    glShadeModel();
  }
  if ((bVar12) ||
     (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) & 8) != 0)) {
    if ((material->field_0xb0 & 8) == 0) {
      glDisable();
    }
    else {
      glEnable();
    }
  }
  if ((bVar12) ||
     (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) >> 8 & 1) != 0)) {
    if ((material->field_0xb1 & 1) == 0) {
      glDisable();
    }
    else {
      glEnable();
    }
  }
  if ((bVar12) ||
     (local_3c = EOFPS_ENABLE,
     ((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) >> 9 & 1) != 0)) {
    if ((material->field_0xb1 & 2) == 0) {
      glDisable();
    }
    else {
      glEnable();
    }
    local_3c = EOFPS_ENABLE;
  }
LAB_001e5f43:
  if ((resetAllRenderStates) ||
     (((*(ushort *)&material->field_0xb0 ^ *(ushort *)&lastmaterial->field_0xb0) & 3) != 0)) {
    iVar4 = 0x1b01;
    if ((*(ushort *)&material->field_0xb0 & 1) == 0) {
      iVar4 = (uint)((*(ushort *)&material->field_0xb0 & 2) == 0) * 2 + 0x1b00;
    }
    glPolygonMode(0x408,iVar4);
  }
  switch(material->ZBuffer) {
  case '\0':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest != false) {
      (*GL.Disable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = false;
    }
    break;
  case '\x01':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x203) {
      (*GL.DepthFunc)(0x203);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x203;
    }
    break;
  case '\x02':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x202) {
      (*GL.DepthFunc)(0x202);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x202;
    }
    break;
  case '\x03':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x201) {
      (*GL.DepthFunc)(0x201);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x201;
    }
    break;
  case '\x04':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x205) {
      (*GL.DepthFunc)(0x205);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x205;
    }
    break;
  case '\x05':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x206) {
      (*GL.DepthFunc)(0x206);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x206;
    }
    break;
  case '\x06':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x204) {
      (*GL.DepthFunc)(0x204);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x204;
    }
    break;
  case '\a':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x207) {
      (*GL.DepthFunc)(0x207);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x207;
    }
    break;
  case '\b':
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthTest == false) {
      (*GL.Enable)(0xb71);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthTest = true;
    }
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthFunc != 0x200) {
      (*GL.DepthFunc)(0x200);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthFunc = 0x200;
    }
  }
  uVar3 = *(uint *)&material->field_0xb0 >> 4 & 3;
  if ((uVar3 - 2 < 2) ||
     ((uVar3 != 0 &&
      (((this->super_CNullDriver).AllowZWriteOnTransparent != false ||
       (iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x67])
                          (this,material), (char)iVar4 == '\0')))))) {
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthMask == false) {
      (*GL.DepthMask)('\x01');
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthMask = true;
    }
  }
  else {
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).DepthMask != false) {
      (*GL.DepthMask)('\0');
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).DepthMask = false;
    }
  }
  uVar3 = *(uint *)&material->field_0xb0;
  if ((~uVar3 & 0xc0) == 0) {
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFaceMode != 0x408) {
      (*GL.CullFace)(0x408);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).CullFaceMode = 0x408;
    }
LAB_001e649c:
    pCVar10 = this->CacheHandler;
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFace == false) {
      (*GL.Enable)(0xb44);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).CullFace = true;
    }
  }
  else {
    pCVar10 = this->CacheHandler;
    if ((uVar3 & 0x40) != 0) {
      if ((pCVar10->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).CullFaceMode != 0x405) {
        (*GL.CullFace)(0x405);
        (pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFaceMode = 0x405;
      }
      goto LAB_001e649c;
    }
    if ((char)uVar3 < '\0') {
      if ((pCVar10->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).CullFaceMode != 0x404) {
        (*GL.CullFace)(0x404);
        (pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFaceMode = 0x404;
      }
      goto LAB_001e649c;
    }
    if ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).CullFace != false) {
      (*GL.Disable)(0xb44);
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).CullFace = false;
    }
  }
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::setColorMask(&this->CacheHandler->
                  super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ,(byte)*(undefined2 *)&material->field_0xa2 & 0xf);
  pCVar10 = this->CacheHandler;
  bVar12 = *(pCVar10->
            super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ).Blend;
  if ((*(ushort *)&material->field_0xa2 & 0x780) == 0) {
    if ((bVar12 != false) ||
       ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).BlendInvalid == true)) {
      (*GL.Disable)(0xbe2);
      uVar6 = (ulong)(pCVar10->
                     super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ).FrameBufferCount;
      if (uVar6 != 0) {
        memset((pCVar10->
               super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ).Blend,0,uVar6);
      }
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).BlendInvalid = false;
    }
  }
  else {
    if ((bVar12 == false) ||
       ((pCVar10->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).BlendInvalid == true)) {
      (*GL.Enable)(0xbe2);
      uVar6 = (ulong)(pCVar10->
                     super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ).FrameBufferCount;
      if (uVar6 != 0) {
        memset((pCVar10->
               super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               ).Blend,1,uVar6);
      }
      (pCVar10->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).BlendInvalid = false;
    }
    iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x21);
    if ((char)iVar4 != '\0') {
      switch(*(ushort *)&material->field_0xa2 >> 7 & 0xf) {
      case 2:
        pCVar10 = this->CacheHandler;
        GVar7 = 0x800a;
        break;
      case 3:
        pCVar10 = this->CacheHandler;
        GVar7 = 0x800b;
        break;
      case 4:
switchD_001e6583_caseD_4:
        pCVar10 = this->CacheHandler;
LAB_001e6685:
        GVar7 = 0x8007;
        break;
      case 5:
switchD_001e6583_caseD_5:
        pCVar10 = this->CacheHandler;
LAB_001e666e:
        GVar7 = 0x8008;
        break;
      case 6:
        pCVar10 = this->CacheHandler;
        if (this->field_0x4d9 != '\x01') goto LAB_001e6685;
        GVar7 = 0x901c;
        break;
      case 7:
        pCVar10 = this->CacheHandler;
        if (this->field_0x4d9 != '\x01') goto LAB_001e666e;
        GVar7 = 0x901d;
        break;
      case 8:
        if (this->field_0x687 != '\x01') {
          if (this->field_0x5a7 != '\x01') goto LAB_001e668f;
          goto switchD_001e6583_caseD_4;
        }
        pCVar10 = this->CacheHandler;
        GVar7 = 0x8320;
        break;
      case 9:
        if (this->field_0x687 != '\x01') {
          if (this->field_0x5a7 != '\x01') goto LAB_001e668f;
          goto switchD_001e6583_caseD_5;
        }
        pCVar10 = this->CacheHandler;
        GVar7 = 0x8321;
        break;
      default:
        pCVar10 = this->CacheHandler;
        GVar7 = 0x8006;
      }
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendEquation(&pCVar10->
                          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                         ,GVar7);
    }
  }
LAB_001e668f:
  fVar13 = material->BlendFactor;
  if ((fVar13 != 0.0) && (material->MaterialType != EMT_ONETEXTURE_BLEND)) {
    local_38 = lastmaterial;
    iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x22);
    uVar3 = ((uint)fVar13 >> 4 & 0xf) - 1;
    if ((char)iVar4 == '\0') {
      GVar5 = 0;
      GVar7 = 0;
      if (uVar3 < 10) {
        GVar7 = *(GLenum *)(&DAT_0023266c + (ulong)uVar3 * 4);
      }
      uVar3 = ((uint)fVar13 & 0xf) - 1;
      if (uVar3 < 10) {
        GVar5 = *(GLenum *)(&DAT_0023266c + (ulong)uVar3 * 4);
      }
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendFunc(&this->CacheHandler->
                      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     ,GVar7,GVar5);
      lastmaterial = local_38;
    }
    else {
      GVar5 = 0;
      GVar7 = 0;
      if (uVar3 < 10) {
        GVar7 = *(GLenum *)(&DAT_0023266c + (ulong)uVar3 * 4);
      }
      uVar3 = ((uint)fVar13 & 0xf) - 1;
      if (uVar3 < 10) {
        GVar5 = *(GLenum *)(&DAT_0023266c + (ulong)uVar3 * 4);
      }
      uVar3 = ((uint)fVar13 >> 0xc & 0xf) - 1;
      destinationAlpha = 0;
      sourceAlpha = 0;
      if (uVar3 < 10) {
        sourceAlpha = *(GLenum *)(&DAT_0023266c + (ulong)uVar3 * 4);
      }
      uVar3 = ((uint)fVar13 >> 8 & 0xf) - 1;
      if (uVar3 < 10) {
        destinationAlpha = *(GLenum *)(&DAT_0023266c + (ulong)uVar3 * 4);
      }
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::setBlendFuncSeparate
                (&this->CacheHandler->
                  super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ,GVar7,GVar5,sourceAlpha,destinationAlpha);
      lastmaterial = local_38;
    }
  }
  iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x20);
  if ((char)iVar4 != '\0') {
    if (!resetAllRenderStates) {
      if (((float)lastmaterial->PolygonOffsetSlopeScale == (float)material->PolygonOffsetSlopeScale)
         && (!NAN((float)lastmaterial->PolygonOffsetSlopeScale) &&
             !NAN((float)material->PolygonOffsetSlopeScale))) {
        if (((float)lastmaterial->PolygonOffsetDepthBias == (float)material->PolygonOffsetDepthBias)
           && (!NAN((float)lastmaterial->PolygonOffsetDepthBias) &&
               !NAN((float)material->PolygonOffsetDepthBias))) goto LAB_001e6876;
      }
    }
    uVar9 = 0x2a01;
    if ((*(ushort *)&lastmaterial->field_0xb0 & 2) == 0) {
      uVar9 = 0x8037;
    }
    if ((*(ushort *)&lastmaterial->field_0xb0 & 1) != 0) {
      uVar9 = 0x2a02;
    }
    glDisable(uVar9);
    fVar13 = 0.0;
    if (((((float)material->PolygonOffsetSlopeScale != 0.0) ||
         (NAN((float)material->PolygonOffsetSlopeScale))) ||
        ((float)material->PolygonOffsetDepthBias != 0.0)) ||
       (NAN((float)material->PolygonOffsetDepthBias))) {
      uVar9 = 0x2a01;
      if ((*(ushort *)&material->field_0xb0 & 2) == 0) {
        uVar9 = 0x8037;
      }
      if ((*(ushort *)&material->field_0xb0 & 1) != 0) {
        uVar9 = 0x2a02;
      }
      glEnable(uVar9);
      fVar15 = material->PolygonOffsetDepthBias;
      fVar13 = material->PolygonOffsetSlopeScale;
    }
    else {
      fVar15 = 0.0;
    }
    glPolygonOffset(fVar13,fVar15);
  }
LAB_001e6876:
  if (!resetAllRenderStates) {
    if (((float)lastmaterial->Thickness == (float)material->Thickness) &&
       (!NAN((float)lastmaterial->Thickness) && !NAN((float)material->Thickness)))
    goto LAB_001e68e2;
  }
  uVar1 = this->AntiAlias;
  fVar14 = *(float *)&this->field_0x4b8;
  if (*(float *)&this->field_0x4b8 <= (float)material->Thickness) {
    fVar14 = (float)material->Thickness;
  }
  if (*(float *)&this->field_0x4bc <= fVar14) {
    fVar14 = *(float *)&this->field_0x4bc;
  }
  glPointSize(fVar14);
  lVar11 = (ulong)(uVar1 != '\0') * 0x10;
  fVar14 = *(float *)(&this->field_0x4b0 + lVar11);
  if (*(float *)(&this->field_0x4b0 + lVar11) <= (float)material->Thickness) {
    fVar14 = (float)material->Thickness;
  }
  if (*(float *)(&this->field_0x4b4 + lVar11) <= fVar14) {
    fVar14 = *(float *)(&this->field_0x4b4 + lVar11);
  }
  glLineWidth(fVar14);
LAB_001e68e2:
  if (((resetAllRenderStates) || (lastmaterial->AntiAliasing != material->AntiAliasing)) &&
     (this->field_0x538 == '\x01')) {
    if ((material->AntiAliasing & 4) == 0) {
      if ((lastmaterial->AntiAliasing & 4) != 0) {
        glDisable(0x809e);
      }
    }
    else {
      glEnable(0x809e);
    }
    if ((this->AntiAlias < 2) || ((material->AntiAliasing & 3) == 0)) {
      glDisable(0x809d);
    }
    else {
      glEnable(0x809d);
      if (this->field_0x63a == '\x01') {
        if ((~material->AntiAliasing & 3) == 0) {
          uVar8 = 0x1102;
        }
        else {
          uVar8 = 0x1101;
        }
        glHint(0x8534,uVar8);
      }
    }
  }
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x79])
            (this,material,resetAllRenderStates);
  this->FixedPipelineState = local_3c;
  return;
}

Assistant:

void COpenGLDriver::setBasicRenderStates(const SMaterial &material, const SMaterial &lastmaterial,
		bool resetAllRenderStates)
{
	// Fixed pipeline isn't important for shader based materials

	E_OPENGL_FIXED_PIPELINE_STATE tempState = FixedPipelineState;

	if (resetAllRenderStates || tempState == EOFPS_ENABLE || tempState == EOFPS_DISABLE_TO_ENABLE) {
		// material colors
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			switch (material.ColorMaterial) {
			case ECM_NONE:
				glDisable(GL_COLOR_MATERIAL);
				break;
			case ECM_DIFFUSE:
				glColorMaterial(GL_FRONT_AND_BACK, GL_DIFFUSE);
				break;
			case ECM_AMBIENT:
				glColorMaterial(GL_FRONT_AND_BACK, GL_AMBIENT);
				break;
			case ECM_EMISSIVE:
				glColorMaterial(GL_FRONT_AND_BACK, GL_EMISSION);
				break;
			case ECM_SPECULAR:
				glColorMaterial(GL_FRONT_AND_BACK, GL_SPECULAR);
				break;
			case ECM_DIFFUSE_AND_AMBIENT:
				glColorMaterial(GL_FRONT_AND_BACK, GL_AMBIENT_AND_DIFFUSE);
				break;
			}
			if (material.ColorMaterial != ECM_NONE)
				glEnable(GL_COLOR_MATERIAL);
		}

		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.AmbientColor != material.AmbientColor ||
				lastmaterial.DiffuseColor != material.DiffuseColor ||
				lastmaterial.EmissiveColor != material.EmissiveColor ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			GLfloat color[4];

			const f32 inv = 1.0f / 255.0f;

			if ((material.ColorMaterial != video::ECM_AMBIENT) &&
					(material.ColorMaterial != video::ECM_DIFFUSE_AND_AMBIENT)) {
				color[0] = material.AmbientColor.getRed() * inv;
				color[1] = material.AmbientColor.getGreen() * inv;
				color[2] = material.AmbientColor.getBlue() * inv;
				color[3] = material.AmbientColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_AMBIENT, color);
			}

			if ((material.ColorMaterial != video::ECM_DIFFUSE) &&
					(material.ColorMaterial != video::ECM_DIFFUSE_AND_AMBIENT)) {
				color[0] = material.DiffuseColor.getRed() * inv;
				color[1] = material.DiffuseColor.getGreen() * inv;
				color[2] = material.DiffuseColor.getBlue() * inv;
				color[3] = material.DiffuseColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, color);
			}

			if (material.ColorMaterial != video::ECM_EMISSIVE) {
				color[0] = material.EmissiveColor.getRed() * inv;
				color[1] = material.EmissiveColor.getGreen() * inv;
				color[2] = material.EmissiveColor.getBlue() * inv;
				color[3] = material.EmissiveColor.getAlpha() * inv;
				glMaterialfv(GL_FRONT_AND_BACK, GL_EMISSION, color);
			}
		}

		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.SpecularColor != material.SpecularColor ||
				lastmaterial.Shininess != material.Shininess ||
				lastmaterial.ColorMaterial != material.ColorMaterial) {
			GLfloat color[4] = {0.f, 0.f, 0.f, 1.f};
			const f32 inv = 1.0f / 255.0f;

			glMaterialf(GL_FRONT_AND_BACK, GL_SHININESS, material.Shininess);
			// disable Specular colors if no shininess is set
			if ((material.Shininess != 0.0f) &&
					(material.ColorMaterial != video::ECM_SPECULAR)) {
#ifdef GL_EXT_separate_specular_color
				if (FeatureAvailable[IRR_EXT_separate_specular_color])
					glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SEPARATE_SPECULAR_COLOR);
#endif
				color[0] = material.SpecularColor.getRed() * inv;
				color[1] = material.SpecularColor.getGreen() * inv;
				color[2] = material.SpecularColor.getBlue() * inv;
				color[3] = material.SpecularColor.getAlpha() * inv;
			}
#ifdef GL_EXT_separate_specular_color
			else if (FeatureAvailable[IRR_EXT_separate_specular_color])
				glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SINGLE_COLOR);
#endif
			glMaterialfv(GL_FRONT_AND_BACK, GL_SPECULAR, color);
		}

		// shademode
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.GouraudShading != material.GouraudShading) {
			if (material.GouraudShading)
				glShadeModel(GL_SMOOTH);
			else
				glShadeModel(GL_FLAT);
		}

		// lighting
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.Lighting != material.Lighting) {
			if (material.Lighting)
				glEnable(GL_LIGHTING);
			else
				glDisable(GL_LIGHTING);
		}

		// fog
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.FogEnable != material.FogEnable) {
			if (material.FogEnable)
				glEnable(GL_FOG);
			else
				glDisable(GL_FOG);
		}

		// normalization
		if (resetAllRenderStates || tempState == EOFPS_DISABLE_TO_ENABLE ||
				lastmaterial.NormalizeNormals != material.NormalizeNormals) {
			if (material.NormalizeNormals)
				glEnable(GL_NORMALIZE);
			else
				glDisable(GL_NORMALIZE);
		}

		// Set fixed pipeline as active.
		tempState = EOFPS_ENABLE;
	} else if (tempState == EOFPS_ENABLE_TO_DISABLE) {
		glDisable(GL_COLOR_MATERIAL);
		glDisable(GL_LIGHTING);
		glDisable(GL_FOG);
		glDisable(GL_NORMALIZE);

		// Set programmable pipeline as active.
		tempState = EOFPS_DISABLE;
	}

	// tempState == EOFPS_DISABLE - driver doesn't calls functions related to fixed pipeline.

	// fillmode - fixed pipeline call, but it emulate GL_LINES behaviour in rendering, so it stay here.
	if (resetAllRenderStates || (lastmaterial.Wireframe != material.Wireframe) || (lastmaterial.PointCloud != material.PointCloud))
		glPolygonMode(GL_FRONT_AND_BACK, material.Wireframe ? GL_LINE : material.PointCloud ? GL_POINT
																							: GL_FILL);

	// ZBuffer
	switch (material.ZBuffer) {
	case ECFN_DISABLED:
		CacheHandler->setDepthTest(false);
		break;
	case ECFN_LESSEQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_LEQUAL);
		break;
	case ECFN_EQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_EQUAL);
		break;
	case ECFN_LESS:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_LESS);
		break;
	case ECFN_NOTEQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_NOTEQUAL);
		break;
	case ECFN_GREATEREQUAL:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_GEQUAL);
		break;
	case ECFN_GREATER:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_GREATER);
		break;
	case ECFN_ALWAYS:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_ALWAYS);
		break;
	case ECFN_NEVER:
		CacheHandler->setDepthTest(true);
		CacheHandler->setDepthFunc(GL_NEVER);
		break;
	default:
		break;
	}

	// ZWrite
	if (getWriteZBuffer(material)) {
		CacheHandler->setDepthMask(true);
	} else {
		CacheHandler->setDepthMask(false);
	}

	// Back face culling
	if ((material.FrontfaceCulling) && (material.BackfaceCulling)) {
		CacheHandler->setCullFaceFunc(GL_FRONT_AND_BACK);
		CacheHandler->setCullFace(true);
	} else if (material.BackfaceCulling) {
		CacheHandler->setCullFaceFunc(GL_BACK);
		CacheHandler->setCullFace(true);
	} else if (material.FrontfaceCulling) {
		CacheHandler->setCullFaceFunc(GL_FRONT);
		CacheHandler->setCullFace(true);
	} else {
		CacheHandler->setCullFace(false);
	}

	// Color Mask
	CacheHandler->setColorMask(material.ColorMask);

	// Blend Equation
	if (material.BlendOperation == EBO_NONE)
		CacheHandler->setBlend(false);
	else {
		CacheHandler->setBlend(true);

#if defined(GL_EXT_blend_subtract) || defined(GL_EXT_blend_minmax) || defined(GL_EXT_blend_logic_op) || defined(GL_VERSION_1_4)
		if (queryFeature(EVDF_BLEND_OPERATIONS)) {
			switch (material.BlendOperation) {
			case EBO_SUBTRACT:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_SUBTRACT);
#elif defined(GL_EXT_blend_subtract)
				CacheHandler->setBlendEquation(GL_FUNC_SUBTRACT_EXT);
#endif
				break;
			case EBO_REVSUBTRACT:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_REVERSE_SUBTRACT);
#elif defined(GL_EXT_blend_subtract)
				CacheHandler->setBlendEquation(GL_FUNC_REVERSE_SUBTRACT_EXT);
#endif
				break;
			case EBO_MIN:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_MIN);
#elif defined(GL_EXT_blend_minmax)
				CacheHandler->setBlendEquation(GL_MIN_EXT);
#endif
				break;
			case EBO_MAX:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_MAX);
#elif defined(GL_EXT_blend_minmax)
				CacheHandler->setBlendEquation(GL_MAX_EXT);
#endif
				break;
			case EBO_MIN_FACTOR:
#if defined(GL_AMD_blend_minmax_factor)
				if (FeatureAvailable[IRR_AMD_blend_minmax_factor])
					CacheHandler->setBlendEquation(GL_FACTOR_MIN_AMD);
#endif
					// fallback in case of missing extension
#if defined(GL_VERSION_1_4)
#if defined(GL_AMD_blend_minmax_factor)
				else
#endif
					CacheHandler->setBlendEquation(GL_MIN);
#endif
				break;
			case EBO_MAX_FACTOR:
#if defined(GL_AMD_blend_minmax_factor)
				if (FeatureAvailable[IRR_AMD_blend_minmax_factor])
					CacheHandler->setBlendEquation(GL_FACTOR_MAX_AMD);
#endif
					// fallback in case of missing extension
#if defined(GL_VERSION_1_4)
#if defined(GL_AMD_blend_minmax_factor)
				else
#endif
					CacheHandler->setBlendEquation(GL_MAX);
#endif
				break;
			case EBO_MIN_ALPHA:
#if defined(GL_SGIX_blend_alpha_minmax)
				if (FeatureAvailable[IRR_SGIX_blend_alpha_minmax])
					CacheHandler->setBlendEquation(GL_ALPHA_MIN_SGIX);
				// fallback in case of missing extension
				else if (FeatureAvailable[IRR_EXT_blend_minmax])
					CacheHandler->setBlendEquation(GL_MIN_EXT);
#endif
				break;
			case EBO_MAX_ALPHA:
#if defined(GL_SGIX_blend_alpha_minmax)
				if (FeatureAvailable[IRR_SGIX_blend_alpha_minmax])
					CacheHandler->setBlendEquation(GL_ALPHA_MAX_SGIX);
				// fallback in case of missing extension
				else if (FeatureAvailable[IRR_EXT_blend_minmax])
					CacheHandler->setBlendEquation(GL_MAX_EXT);
#endif
				break;
			default:
#if defined(GL_VERSION_1_4)
				CacheHandler->setBlendEquation(GL_FUNC_ADD);
#elif defined(GL_EXT_blend_subtract) || defined(GL_EXT_blend_minmax) || defined(GL_EXT_blend_logic_op)
				CacheHandler->setBlendEquation(GL_FUNC_ADD_EXT);
#endif
				break;
			}
		}
#endif
	}

	// Blend Factor
	if (IR(material.BlendFactor) & 0xFFFFFFFF // TODO: why the & 0xFFFFFFFF?
			&& material.MaterialType != EMT_ONETEXTURE_BLEND) {
		E_BLEND_FACTOR srcRGBFact = EBF_ZERO;
		E_BLEND_FACTOR dstRGBFact = EBF_ZERO;
		E_BLEND_FACTOR srcAlphaFact = EBF_ZERO;
		E_BLEND_FACTOR dstAlphaFact = EBF_ZERO;
		E_MODULATE_FUNC modulo = EMFN_MODULATE_1X;
		u32 alphaSource = 0;

		unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulo, alphaSource, material.BlendFactor);

		if (queryFeature(EVDF_BLEND_SEPARATE)) {
			CacheHandler->setBlendFuncSeparate(getGLBlend(srcRGBFact), getGLBlend(dstRGBFact),
					getGLBlend(srcAlphaFact), getGLBlend(dstAlphaFact));
		} else {
			CacheHandler->setBlendFunc(getGLBlend(srcRGBFact), getGLBlend(dstRGBFact));
		}
	}

	// Polygon Offset
	if (queryFeature(EVDF_POLYGON_OFFSET) && (resetAllRenderStates ||
													 lastmaterial.PolygonOffsetSlopeScale != material.PolygonOffsetSlopeScale ||
													 lastmaterial.PolygonOffsetDepthBias != material.PolygonOffsetDepthBias)) {
		glDisable(lastmaterial.Wireframe ? GL_POLYGON_OFFSET_LINE : lastmaterial.PointCloud ? GL_POLYGON_OFFSET_POINT
																							: GL_POLYGON_OFFSET_FILL);
		if (material.PolygonOffsetSlopeScale || material.PolygonOffsetDepthBias) {
			glEnable(material.Wireframe ? GL_POLYGON_OFFSET_LINE : material.PointCloud ? GL_POLYGON_OFFSET_POINT
																					   : GL_POLYGON_OFFSET_FILL);

			glPolygonOffset(material.PolygonOffsetSlopeScale, material.PolygonOffsetDepthBias);
		} else {
			glPolygonOffset(0.0f, 0.f);
		}
	}

	// thickness
	if (resetAllRenderStates || lastmaterial.Thickness != material.Thickness) {
		if (AntiAlias) {
			//			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimSmoothedPoint[0], DimSmoothedPoint[1]));
			// we don't use point smoothing
			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedPoint[0], DimAliasedPoint[1]));
			glLineWidth(core::clamp(static_cast<GLfloat>(material.Thickness), DimSmoothedLine[0], DimSmoothedLine[1]));
		} else {
			glPointSize(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedPoint[0], DimAliasedPoint[1]));
			glLineWidth(core::clamp(static_cast<GLfloat>(material.Thickness), DimAliasedLine[0], DimAliasedLine[1]));
		}
	}

	// Anti aliasing
	if ((resetAllRenderStates || lastmaterial.AntiAliasing != material.AntiAliasing) && FeatureAvailable[IRR_ARB_multisample]) {
		if (material.AntiAliasing & EAAM_ALPHA_TO_COVERAGE)
			glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE_ARB);
		else if (lastmaterial.AntiAliasing & EAAM_ALPHA_TO_COVERAGE)
			glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE_ARB);

		if ((AntiAlias >= 2) && (material.AntiAliasing & (EAAM_SIMPLE | EAAM_QUALITY))) {
			glEnable(GL_MULTISAMPLE_ARB);
#ifdef GL_NV_multisample_filter_hint
			if (FeatureAvailable[IRR_NV_multisample_filter_hint]) {
				if ((material.AntiAliasing & EAAM_QUALITY) == EAAM_QUALITY)
					glHint(GL_MULTISAMPLE_FILTER_HINT_NV, GL_NICEST);
				else
					glHint(GL_MULTISAMPLE_FILTER_HINT_NV, GL_FASTEST);
			}
#endif
		} else
			glDisable(GL_MULTISAMPLE_ARB);
	}

	// Texture parameters
	setTextureRenderStates(material, resetAllRenderStates);

	// set current fixed pipeline state
	FixedPipelineState = tempState;
}